

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

float4x4 * ConvexDecomposition::MatrixRigidInverse(float4x4 *__return_storage_ptr__,float4x4 *m)

{
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [56];
  undefined1 auVar1 [64];
  float3 fVar3;
  float4x4 local_90;
  float4x4 local_50;
  
  auVar2 = in_ZMM0._8_56_;
  fVar3 = operator-((float3 *)&m->w);
  local_50.w.z = fVar3.z;
  auVar1._0_8_ = fVar3._0_8_;
  auVar1._8_56_ = auVar2;
  local_50.x.x = 1.0;
  local_50.x.y = 0.0;
  local_50.x.z = 0.0;
  local_50.x.w = 0.0;
  local_50.y.x = 0.0;
  local_50.y.y = 1.0;
  local_50.y.z = 0.0;
  local_50.y.w = 0.0;
  local_50.z.x = 0.0;
  local_50.z.y = 0.0;
  local_50._40_16_ = vmovlhps_avx(SUB6416(ZEXT464(0x3f800000),0),auVar1._0_16_);
  local_50.w.w = 1.0;
  local_90.x.x = (m->x).x;
  local_90.y.x = (m->x).y;
  local_90.z.x = (m->x).z;
  local_90.x.y = (m->y).x;
  local_90.y.y = (m->y).y;
  local_90.z.y = (m->y).z;
  local_90.x.z = (m->z).x;
  local_90.y.z = (m->z).y;
  local_90.z.z = (m->z).z;
  local_90.w.x = (m->x).w;
  local_90.w.y = (m->y).w;
  local_90.w.z = (m->z).w;
  local_90.x.w = 0.0;
  local_90.y.w = 0.0;
  local_90.z.w = 0.0;
  local_90.w.w = 1.0;
  operator*(__return_storage_ptr__,&local_50,&local_90);
  return __return_storage_ptr__;
}

Assistant:

float4x4 MatrixRigidInverse(const float4x4 &m)
{
	float4x4 trans_inverse = MatrixTranslation(-m.w.xyz());
	float4x4 rot   = m;
	rot.w = float4(0,0,0,1);
	return trans_inverse * MatrixTranspose(rot);
}